

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O0

bool __thiscall
EnrichableAnalyzerSubprocess::GetInputLine
          (EnrichableAnalyzerSubprocess *this,char *buffer,uint bufferLength)

{
  size_t sVar1;
  int result_1;
  bool result;
  uint bufferPos;
  uint bufferLength_local;
  char *buffer_local;
  EnrichableAnalyzerSubprocess *this_local;
  
  result_1 = 0;
  do {
    read(this->inpipefd[0],buffer + (uint)result_1,1);
    if (buffer[(uint)result_1] == '\n') break;
    result_1 = result_1 + 1;
  } while (result_1 != bufferLength - 1);
  buffer[(uint)result_1] = '\0';
  sVar1 = strlen(buffer);
  return sVar1 != 0;
}

Assistant:

bool EnrichableAnalyzerSubprocess::GetInputLine(char* buffer, unsigned bufferLength) {
	unsigned bufferPos = 0;
	bool result = false;

	#ifdef SUBPROCESS_DEBUG
		std::cerr << "<< ";
	#endif

	while(true) {
		int result = read(inpipefd[0], &buffer[bufferPos], 1);
		if(buffer[bufferPos] == '\n') {
			break;
		}

		#ifdef SUBPROCESS_DEBUG
			std::cerr << buffer[bufferPos];
		#endif

		bufferPos++;

		if(bufferPos == bufferLength - 1) {
			break;
		}
	}
	buffer[bufferPos] = '\0';

	#ifdef SUBPROCESS_DEBUG
		std::cerr << '\n';
	#endif

	if(strlen(buffer) > 0) {
		result = true;
	}

	return result;
}